

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpOps.cpp
# Opt level: O3

sz_ssize_t sznet::net::sockets::sz_udp_send(sz_sock sock,void *buf,int size,sockaddr *addr)

{
  ssize_t sVar1;
  
  sVar1 = sendto(sock,buf,(long)size,0,(sockaddr *)addr,0x10);
  return sVar1;
}

Assistant:

sz_ssize_t sz_udp_send(sz_sock sock, const void* buf, int size, const struct sockaddr* addr)
{
#if defined(SZ_OS_LINUX)
	const void* sendBuf = buf;
	size_t sendBufSize = implicit_cast<size_t>(size);
	socklen_t lenAddr = sizeof(*addr);
#else
	const char* sendBuf = reinterpret_cast<const char*>(buf);
	int sendBufSize = size;
	int lenAddr = sizeof(*addr);
#endif

	return ::sendto(sock, sendBuf, sendBufSize, 0, addr, lenAddr);
}